

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

lws_mqtt_stateful_primitive_return_t lws_mqtt_mb_parse(lws_mqtt_vbi *vbi,uint8_t **in,size_t *len)

{
  uint32_t uVar1;
  byte *pbVar2;
  size_t sVar3;
  char cVar4;
  
  cVar4 = vbi->budget;
  if (cVar4 == '\0') {
    return LMSPR_FAILED_ALREADY_COMPLETED;
  }
  sVar3 = *len;
  if (sVar3 == 0) {
    return LMSPR_NEED_MORE;
  }
  do {
    cVar4 = cVar4 + -1;
    sVar3 = sVar3 - 1;
    vbi->budget = cVar4;
    if (cVar4 == -1) break;
    uVar1 = vbi->value;
    pbVar2 = *in;
    *in = pbVar2 + 1;
    vbi->value = (uint)*pbVar2 | uVar1 << 8;
    *len = sVar3;
    vbi->consumed = vbi->consumed + '\x01';
  } while (sVar3 != 0);
  return (lws_mqtt_stateful_primitive_return_t)(cVar4 != '\0');
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_mb_parse(lws_mqtt_vbi *vbi, const uint8_t **in, size_t *len)
{
	if (!vbi->budget)
		return LMSPR_FAILED_ALREADY_COMPLETED;

	while (*len && vbi->budget--) {
		vbi->value = (vbi->value << 8) | *((*in)++);
		(*len)--;
		vbi->consumed++;
	}

	return vbi->budget ? LMSPR_NEED_MORE : LMSPR_COMPLETED;
}